

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O0

Hop_Obj_t * Hop_ObjChild1Copy(Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *local_18;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 == 0) {
    pHVar2 = Hop_ObjFanin1(pObj);
    if (pHVar2 == (Hop_Obj_t *)0x0) {
      local_18 = (Hop_Obj_t *)0x0;
    }
    else {
      pHVar2 = Hop_ObjFanin1(pObj);
      pHVar2 = (Hop_Obj_t *)(pHVar2->field_0).pData;
      iVar1 = Hop_ObjFaninC1(pObj);
      local_18 = Hop_NotCond(pHVar2,iVar1);
    }
    return local_18;
  }
  __assert_fail("!Hop_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hop.h"
                ,0xbb,"Hop_Obj_t *Hop_ObjChild1Copy(Hop_Obj_t *)");
}

Assistant:

static inline Hop_Obj_t *  Hop_ObjChild1Copy( Hop_Obj_t * pObj )  { assert( !Hop_IsComplement(pObj) ); return Hop_ObjFanin1(pObj)? Hop_NotCond((Hop_Obj_t *)Hop_ObjFanin1(pObj)->pData, Hop_ObjFaninC1(pObj)) : NULL;  }